

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cTextureViewTests.cpp
# Opt level: O1

Vec4 __thiscall
gl4cts::TextureViewTestViewSampling::getRandomReferenceColor(TextureViewTestViewSampling *this)

{
  Vec4 *result;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  Vec4 VVar1;
  
  VVar1.m_data[1] = (undefined4)((ulong)in_XMM0_Qa >> 0x20);
  VVar1.m_data[3] = (undefined4)((ulong)in_XMM1_Qa >> 0x20);
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)0x0;
  (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx = (TestContext *)0x0;
  VVar1.m_data[0] = (float)(getRandomReferenceColor::seed % 0xff) / 255.0;
  VVar1.m_data[2] =
       (float)(int)(((getRandomReferenceColor::seed * 8) / 0xff) * -0xff +
                   getRandomReferenceColor::seed * 8) / 255.0;
  *(float *)&(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode = VVar1.m_data[0];
  *(float *)((long)&(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode + 4) =
       VVar1.m_data[2];
  *(float *)&(this->super_TestCase).super_TestCase.super_TestNode.m_testCtx =
       (float)((getRandomReferenceColor::seed * 0x10) % 0xff) / 255.0;
  *(float *)((long)&(this->super_TestCase).super_TestCase.super_TestNode.m_testCtx + 4) =
       (float)((getRandomReferenceColor::seed * 0x20) % 0xff) / 255.0;
  getRandomReferenceColor::seed = getRandomReferenceColor::seed + 0x11;
  return (Vec4)VVar1.m_data;
}

Assistant:

tcu::Vec4 TextureViewTestViewSampling::getRandomReferenceColor()
{
	static unsigned int seed = 195;
	tcu::Vec4			result;

	result = tcu::Vec4(float((seed) % 255) / 255.0f, float((seed << 3) % 255) / 255.0f,
					   float((seed << 4) % 255) / 255.0f, float((seed << 5) % 255) / 255.0f);

	seed += 17;

	return result;
}